

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fspec.cc
# Opt level: O0

void __thiscall
ParamListStandard::restoreXml
          (ParamListStandard *this,Element *el,AddrSpaceManager *manage,
          vector<EffectRecord,_std::allocator<EffectRecord>_> *effectlist,bool normalstack)

{
  long lVar1;
  bool bVar2;
  int4 iVar3;
  _Ios_Fmtflags _Var4;
  type_metatype tVar5;
  spacetype sVar6;
  int4 iVar7;
  string *psVar8;
  reference ppEVar9;
  reference pvVar10;
  LowlevelError *pLVar11;
  allocator local_2a9;
  string local_2a8 [36];
  int local_284;
  undefined1 local_280 [4];
  int4 maxgroup;
  AddrSpace *local_260;
  AddrSpace *spc;
  string local_250 [32];
  ParamEntry local_230;
  Element *local_1f8;
  Element *subel;
  Element **local_1e8;
  __normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_> local_1e0
  ;
  const_iterator fiter;
  List *flist;
  long local_1c0;
  istringstream i1;
  string *attrname;
  int4 i;
  bool autokilledbycall;
  int4 lastgroup;
  bool normalstack_local;
  vector<EffectRecord,_std::allocator<EffectRecord>_> *effectlist_local;
  AddrSpaceManager *manage_local;
  Element *el_local;
  ParamListStandard *this_local;
  
  i = -1;
  this->numgroup = 0;
  this->spacebase = (AddrSpace *)0x0;
  this->pointermax = 0;
  this->thisbeforeret = false;
  attrname._7_1_ = false;
  for (attrname._0_4_ = 0; iVar3 = Element::getNumAttributes(el), (int)attrname < iVar3;
      attrname._0_4_ = (int)attrname + 1) {
    psVar8 = Element::getAttributeName_abi_cxx11_(el,(int)attrname);
    bVar2 = std::operator==(psVar8,"pointermax");
    if (bVar2) {
      psVar8 = Element::getAttributeValue_abi_cxx11_(el,(int)attrname);
      std::__cxx11::istringstream::istringstream((istringstream *)&local_1c0,psVar8);
      lVar1 = *(long *)(local_1c0 + -0x18);
      _Var4 = std::operator|(_S_dec,_S_hex);
      _Var4 = std::operator|(_Var4,_S_oct);
      std::ios_base::unsetf((ios_base *)((long)&local_1c0 + lVar1),_Var4);
      std::istream::operator>>(&local_1c0,&this->pointermax);
      std::__cxx11::istringstream::~istringstream((istringstream *)&local_1c0);
    }
    else {
      bVar2 = std::operator==(psVar8,"thisbeforeretpointer");
      if (bVar2) {
        psVar8 = Element::getAttributeValue_abi_cxx11_(el,(int)attrname);
        bVar2 = xml_readbool(psVar8);
        this->thisbeforeret = bVar2;
      }
      else {
        bVar2 = std::operator==(psVar8,"killedbycall");
        if (bVar2) {
          psVar8 = Element::getAttributeValue_abi_cxx11_(el,(int)attrname);
          attrname._7_1_ = xml_readbool(psVar8);
        }
      }
    }
  }
  this->nonfloatgroup = -1;
  fiter._M_current = (Element **)Element::getChildren(el);
  __gnu_cxx::
  __normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_>::
  __normal_iterator(&local_1e0);
  local_1e8 = (Element **)
              std::vector<Element_*,_std::allocator<Element_*>_>::begin(fiter._M_current);
  local_1e0._M_current = local_1e8;
  do {
    subel = (Element *)
            std::vector<Element_*,_std::allocator<Element_*>_>::end
                      ((vector<Element_*,_std::allocator<Element_*>_> *)fiter._M_current);
    bVar2 = __gnu_cxx::operator!=
                      (&local_1e0,
                       (__normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_>
                        *)&subel);
    if (!bVar2) {
      calcDelay(this);
      populateResolver(this);
      return;
    }
    ppEVar9 = __gnu_cxx::
              __normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_>
              ::operator*(&local_1e0);
    local_1f8 = *ppEVar9;
    psVar8 = Element::getName_abi_cxx11_(local_1f8);
    bVar2 = std::operator==(psVar8,"pentry");
    if (bVar2) {
      ParamEntry::ParamEntry(&local_230,this->numgroup);
      std::__cxx11::list<ParamEntry,_std::allocator<ParamEntry>_>::push_back
                (&this->entry,&local_230);
      pvVar10 = std::__cxx11::list<ParamEntry,_std::allocator<ParamEntry>_>::back(&this->entry);
      ParamEntry::restoreXml(pvVar10,local_1f8,manage,normalstack);
      pvVar10 = std::__cxx11::list<ParamEntry,_std::allocator<ParamEntry>_>::back(&this->entry);
      tVar5 = ParamEntry::getType(pvVar10);
      if (tVar5 == TYPE_FLOAT) {
        if (-1 < this->nonfloatgroup) {
          spc._6_1_ = 1;
          pLVar11 = (LowlevelError *)__cxa_allocate_exception(0x20);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_250,"parameter list floating-point entries must come first",
                     (allocator *)((long)&spc + 7));
          LowlevelError::LowlevelError(pLVar11,(string *)local_250);
          spc._6_1_ = 0;
          __cxa_throw(pLVar11,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
        }
      }
      else if (this->nonfloatgroup < 0) {
        this->nonfloatgroup = this->numgroup;
      }
      pvVar10 = std::__cxx11::list<ParamEntry,_std::allocator<ParamEntry>_>::back(&this->entry);
      local_260 = ParamEntry::getSpace(pvVar10);
      sVar6 = AddrSpace::getType(local_260);
      if (sVar6 == IPTR_SPACEBASE) {
        this->spacebase = local_260;
      }
      else if (attrname._7_1_ != false) {
        pvVar10 = std::__cxx11::list<ParamEntry,_std::allocator<ParamEntry>_>::back(&this->entry);
        EffectRecord::EffectRecord((EffectRecord *)local_280,pvVar10,2);
        std::vector<EffectRecord,_std::allocator<EffectRecord>_>::push_back
                  (effectlist,(value_type *)local_280);
      }
      pvVar10 = std::__cxx11::list<ParamEntry,_std::allocator<ParamEntry>_>::back(&this->entry);
      iVar3 = ParamEntry::getGroup(pvVar10);
      pvVar10 = std::__cxx11::list<ParamEntry,_std::allocator<ParamEntry>_>::back(&this->entry);
      iVar7 = ParamEntry::getGroupSize(pvVar10);
      local_284 = iVar3 + iVar7;
      if (this->numgroup < local_284) {
        this->numgroup = local_284;
      }
      pvVar10 = std::__cxx11::list<ParamEntry,_std::allocator<ParamEntry>_>::back(&this->entry);
      iVar3 = ParamEntry::getGroup(pvVar10);
      if (iVar3 < i) {
        pLVar11 = (LowlevelError *)__cxa_allocate_exception(0x20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2a8,"pentrys must come in group order",&local_2a9);
        LowlevelError::LowlevelError(pLVar11,(string *)local_2a8);
        __cxa_throw(pLVar11,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
      }
      pvVar10 = std::__cxx11::list<ParamEntry,_std::allocator<ParamEntry>_>::back(&this->entry);
      i = ParamEntry::getGroup(pvVar10);
    }
    __gnu_cxx::
    __normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_>::
    operator++(&local_1e0);
  } while( true );
}

Assistant:

void ParamListStandard::restoreXml(const Element *el,const AddrSpaceManager *manage,
				   vector<EffectRecord> &effectlist,bool normalstack)

{
  int4 lastgroup = -1;
  numgroup = 0;
  spacebase = (AddrSpace *)0;
  pointermax = 0;
  thisbeforeret = false;
  bool autokilledbycall = false;
  for(int4 i=0;i<el->getNumAttributes();++i) {
    const string &attrname( el->getAttributeName(i) );
    if (attrname == "pointermax") {
      istringstream i1(el->getAttributeValue(i));
      i1.unsetf(ios::dec | ios::hex | ios::oct);
      i1 >> pointermax;
    }
    else if (attrname == "thisbeforeretpointer") {
      thisbeforeret = xml_readbool( el->getAttributeValue(i) );
    }
    else if (attrname == "killedbycall") {
      autokilledbycall = xml_readbool( el->getAttributeValue(i) );
    }
  }
  nonfloatgroup = -1;		// We haven't seen any integer slots yet
  const List &flist(el->getChildren());
  List::const_iterator fiter;
  for(fiter=flist.begin();fiter!=flist.end();++fiter) {
    const Element *subel = *fiter;
    if (subel->getName() == "pentry") {
      entry.push_back(ParamEntry(numgroup));
      entry.back().restoreXml(subel,manage,normalstack);
      if (entry.back().getType()==TYPE_FLOAT) {
	  if (nonfloatgroup >= 0)
	    throw LowlevelError("parameter list floating-point entries must come first");
      }
      else if (nonfloatgroup < 0)
	nonfloatgroup = numgroup; // First time we have seen an integer slot
      AddrSpace *spc = entry.back().getSpace();
      if (spc->getType() == IPTR_SPACEBASE)
	spacebase = spc;
      else if (autokilledbycall)	// If a register parameter AND we automatically generate killedbycall
	effectlist.push_back(EffectRecord(entry.back(),EffectRecord::killedbycall));

      int4 maxgroup = entry.back().getGroup() + entry.back().getGroupSize();
      if (maxgroup > numgroup)
	numgroup = maxgroup;
      if (entry.back().getGroup() < lastgroup)
	throw LowlevelError("pentrys must come in group order");
      lastgroup = entry.back().getGroup();
    }
  }
  calcDelay();
  populateResolver();
}